

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameters_tests.c
# Opt level: O0

void can_create_markers_for_mixed_parameters(void)

{
  byte bVar1;
  int iVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  byte *pbVar5;
  CgreenVector *markers;
  
  uVar3 = create_vector_of_double_markers_for("a, box_double(b), c,d,box_double(e)");
  iVar2 = cgreen_vector_size(uVar3);
  uVar4 = create_equal_to_value_constraint(5,"5");
  assert_core_("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/parameters_tests.c"
               ,0x93,"cgreen_vector_size(markers)",(long)iVar2,uVar4);
  pbVar5 = (byte *)cgreen_vector_get(uVar3,0);
  bVar1 = *pbVar5;
  uVar4 = create_is_true_constraint();
  assert_core_("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/parameters_tests.c"
               ,0x94,"!*(_Bool*)cgreen_vector_get(markers, 0)",(bVar1 ^ 0xff) & 1,uVar4);
  pbVar5 = (byte *)cgreen_vector_get(uVar3,1);
  bVar1 = *pbVar5;
  uVar4 = create_is_true_constraint();
  assert_core_("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/parameters_tests.c"
               ,0x95,"*(_Bool*)cgreen_vector_get(markers, 1)",bVar1 & 1,uVar4);
  pbVar5 = (byte *)cgreen_vector_get(uVar3,2);
  bVar1 = *pbVar5;
  uVar4 = create_is_true_constraint();
  assert_core_("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/parameters_tests.c"
               ,0x96,"!*(_Bool*)cgreen_vector_get(markers, 2)",(bVar1 ^ 0xff) & 1,uVar4);
  pbVar5 = (byte *)cgreen_vector_get(uVar3,3);
  bVar1 = *pbVar5;
  uVar4 = create_is_true_constraint();
  assert_core_("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/parameters_tests.c"
               ,0x97,"!*(_Bool*)cgreen_vector_get(markers, 3)",(bVar1 ^ 0xff) & 1,uVar4);
  pbVar5 = (byte *)cgreen_vector_get(uVar3,4);
  bVar1 = *pbVar5;
  uVar4 = create_is_true_constraint();
  assert_core_("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/parameters_tests.c"
               ,0x98,"*(_Bool*)cgreen_vector_get(markers, 4)",bVar1 & 1,uVar4);
  destroy_cgreen_vector(uVar3);
  return;
}

Assistant:

Ensure(can_create_markers_for_mixed_parameters) {
    CgreenVector *markers = create_vector_of_double_markers_for("a, box_double(b), c,d,box_double(e)");
    assert_that(cgreen_vector_size(markers), is_equal_to(5));
    assert_that(!*(bool*)cgreen_vector_get(markers, 0));
    assert_that(*(bool*)cgreen_vector_get(markers, 1));
    assert_that(!*(bool*)cgreen_vector_get(markers, 2));
    assert_that(!*(bool*)cgreen_vector_get(markers, 3));
    assert_that(*(bool*)cgreen_vector_get(markers, 4));
    destroy_cgreen_vector(markers);
}